

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_channel_converter_init_preallocated
                    (ma_channel_converter_config *pConfig,void *pHeap,
                    ma_channel_converter *pConverter)

{
  ma_format mVar1;
  ma_channel_mix_mode mVar2;
  ma_channel *pmVar3;
  float *pfVar4;
  ma_channel mVar5;
  ma_channel mVar6;
  byte bVar7;
  byte bVar8;
  ma_result mVar9;
  ma_channel_conversion_path mVar10;
  ma_bool32 mVar11;
  ma_uint32 mVar12;
  ma_uint8 *pmVar13;
  float **ppfVar14;
  long lVar15;
  uint uVar16;
  ma_channel *pmVar17;
  uint uVar18;
  ma_uint32 mVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  ma_uint32 iChannelOutLFE;
  ma_channel_converter_heap_layout heapLayout;
  ulong local_90;
  uint local_5c;
  ma_channel_converter_heap_layout local_58;
  
  if (pConverter == (ma_channel_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  pConverter->weights = (anon_union_8_2_43a84514_for_weights)0x0;
  pConverter->_pHeap = (void *)0x0;
  pConverter->pChannelMapOut = (ma_channel *)0x0;
  pConverter->pShuffleTable = (ma_uint8 *)0x0;
  pConverter->conversionPath = ma_channel_conversion_path_unknown;
  *(undefined4 *)&pConverter->field_0x14 = 0;
  pConverter->pChannelMapIn = (ma_channel *)0x0;
  pConverter->format = ma_format_unknown;
  pConverter->channelsIn = 0;
  pConverter->channelsOut = 0;
  pConverter->mixingMode = ma_channel_mix_mode_default;
  *(undefined8 *)&pConverter->_ownsHeap = 0;
  mVar9 = ma_channel_converter_get_heap_layout(pConfig,&local_58);
  if (mVar9 != MA_SUCCESS) {
    return mVar9;
  }
  pConverter->_pHeap = pHeap;
  if (local_58.sizeInBytes != 0 && pHeap != (void *)0x0) {
    memset(pHeap,0,local_58.sizeInBytes);
  }
  pConverter->format = pConfig->format;
  uVar22._0_4_ = pConfig->channelsIn;
  uVar22._4_4_ = pConfig->channelsOut;
  pConverter->channelsIn = (undefined4)uVar22;
  pConverter->channelsOut = uVar22._4_4_;
  pConverter->mixingMode = pConfig->mixingMode;
  pmVar17 = pConfig->pChannelMapIn;
  if (pmVar17 == (ma_channel *)0x0) {
    pConverter->pChannelMapIn = (ma_channel *)0x0;
  }
  else {
    pConverter->pChannelMapIn = (ma_channel *)(local_58.channelMapInOffset + (long)pHeap);
    if ((undefined4)uVar22 != 0 && pHeap != (void *)0x0) {
      memcpy((ma_channel *)(local_58.channelMapInOffset + (long)pHeap),pmVar17,uVar22 & 0xffffffff);
    }
  }
  pmVar17 = pConfig->pChannelMapOut;
  if (pmVar17 == (ma_channel *)0x0) {
    pConverter->pChannelMapOut = (ma_channel *)0x0;
    pmVar17 = (ma_channel *)0x0;
  }
  else {
    pConverter->pChannelMapOut = (ma_channel *)(local_58.channelMapOutOffset + (long)pHeap);
    if (pHeap != (void *)0x0 && (ulong)pConfig->channelsOut != 0) {
      memcpy((ma_channel *)(local_58.channelMapOutOffset + (long)pHeap),pmVar17,
             (ulong)pConfig->channelsOut);
      pmVar17 = pConfig->pChannelMapOut;
    }
  }
  mVar10 = ma_channel_map_get_conversion_path
                     (pConfig->pChannelMapIn,pConfig->channelsIn,pmVar17,pConfig->channelsOut,
                      pConfig->mixingMode);
  pConverter->conversionPath = mVar10;
  if (mVar10 == ma_channel_conversion_path_shuffle) {
    pmVar13 = (ma_uint8 *)(local_58.shuffleTableOffset + (long)pHeap);
    pConverter->pShuffleTable = pmVar13;
    uVar16 = pConverter->channelsIn;
    uVar18 = pConverter->channelsOut;
    if ((pHeap == (void *)0x0 || (ulong)uVar16 == 0) || (ulong)uVar18 == 0) {
      return MA_SUCCESS;
    }
    pmVar17 = pConverter->pChannelMapIn;
    pmVar3 = pConverter->pChannelMapOut;
    uVar22 = 0;
    do {
      pmVar13[uVar22] = 0xff;
      if (pmVar3 == (ma_channel *)0x0) {
        bVar8 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,uVar18,(ma_uint32)uVar22);
      }
      else {
        bVar8 = pmVar3[uVar22];
      }
      uVar20 = 0;
      do {
        if (pmVar17 == (ma_channel *)0x0) {
          bVar7 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,uVar16,(ma_uint32)uVar20);
        }
        else {
          bVar7 = pmVar17[uVar20];
        }
        if (bVar8 == bVar7) {
          pmVar13[uVar22] = (ma_uint8)uVar20;
          break;
        }
        if (bVar8 < 0xb) {
          if (bVar8 == 2) {
LAB_00141ed1:
            if ((bVar7 == 2) || (bVar7 == 0xb)) goto LAB_00141eeb;
          }
          else if (bVar8 == 3) goto LAB_00141edf;
        }
        else {
          if (bVar8 != 0xc) {
            if (bVar8 != 0xb) goto LAB_00141ef4;
            goto LAB_00141ed1;
          }
LAB_00141edf:
          if ((bVar7 != 3) && (bVar7 != 0xc)) goto LAB_00141ef4;
LAB_00141eeb:
          pmVar13[uVar22] = (ma_uint8)uVar20;
        }
LAB_00141ef4:
        uVar20 = uVar20 + 1;
      } while (uVar16 != uVar20);
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar18);
    mVar10 = pConverter->conversionPath;
  }
  if (mVar10 != ma_channel_conversion_path_weights) {
    return MA_SUCCESS;
  }
  mVar1 = pConverter->format;
  uVar16 = pConverter->channelsIn;
  uVar22 = (ulong)uVar16;
  ppfVar14 = (float **)((long)pHeap + local_58.weightsOffset);
  (pConverter->weights).f32 = ppfVar14;
  if (mVar1 == ma_format_f32) {
    if (uVar16 != 0) {
      uVar18 = pConverter->channelsOut;
      ppfVar14 = ppfVar14 + uVar22;
      uVar20 = 0;
      do {
        (pConverter->weights).f32[uVar20] = (float *)ppfVar14;
        uVar20 = uVar20 + 1;
        ppfVar14 = (float **)((long)ppfVar14 + (ulong)uVar18 * 4);
      } while (uVar22 != uVar20);
LAB_00141fac:
      if (uVar16 != 0) {
        uVar16 = pConverter->channelsOut;
        uVar21 = (ulong)uVar16;
        uVar20 = 0;
        do {
          if (uVar16 == 0) {
            uVar16 = 0;
          }
          else {
            uVar22 = 0;
            do {
              if (mVar1 == ma_format_f32) {
                (pConverter->weights).f32[uVar20][uVar22] = 0.0;
              }
              else {
                (pConverter->weights).f32[uVar20][uVar22] = 0.0;
                uVar21 = (ulong)pConverter->channelsOut;
              }
              uVar22 = uVar22 + 1;
              uVar16 = (uint)uVar21;
            } while (uVar22 < uVar21);
            uVar22 = (ulong)pConverter->channelsIn;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar22);
        if ((int)uVar22 != 0) {
          pmVar17 = pConverter->pChannelMapIn;
          uVar20 = 0;
          do {
            if (pmVar17 == (ma_channel *)0x0) {
              mVar5 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,(ma_uint32)uVar22,(ma_uint32)uVar20
                                );
            }
            else {
              mVar5 = pmVar17[uVar20];
            }
            mVar19 = pConverter->channelsOut;
            if (mVar19 != 0) {
              pmVar3 = pConverter->pChannelMapOut;
              uVar22 = 0;
              do {
                if (pmVar3 == (ma_channel *)0x0) {
                  mVar6 = ma_channel_map_init_standard_channel
                                    (ma_standard_channel_map_default,mVar19,(ma_uint32)uVar22);
                }
                else {
                  mVar6 = pmVar3[uVar22];
                }
                if (mVar5 == mVar6) {
                  if (mVar1 == ma_format_f32) {
                    (pConverter->weights).f32[uVar20][uVar22] = 1.0;
                  }
                  else {
                    (pConverter->weights).f32[uVar20][uVar22] = 5.73972e-42;
                    mVar19 = pConverter->channelsOut;
                  }
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 < mVar19);
              uVar22 = (ulong)pConverter->channelsIn;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < uVar22);
          goto LAB_001420b4;
        }
      }
    }
  }
  else if (uVar16 != 0) {
    uVar18 = pConverter->channelsOut;
    ppfVar14 = ppfVar14 + uVar22;
    uVar20 = 0;
    do {
      (pConverter->weights).f32[uVar20] = (float *)ppfVar14;
      uVar20 = uVar20 + 1;
      ppfVar14 = (float **)((long)ppfVar14 + (ulong)uVar18 * 4);
    } while (uVar22 != uVar20);
    goto LAB_00141fac;
  }
  uVar22 = 0;
LAB_001420b4:
  mVar2 = pConverter->mixingMode;
  if (mVar2 != ma_channel_mix_mode_simple) {
    if (mVar2 == ma_channel_mix_mode_custom_weights) {
      ppfVar14 = pConfig->ppWeights;
      if (ppfVar14 == (float **)0x0) {
        return MA_INVALID_ARGS;
      }
      if ((int)uVar22 == 0) {
        return MA_SUCCESS;
      }
      uVar16 = pConverter->channelsOut;
      uVar20 = 0;
      uVar18 = uVar16;
      do {
        if (uVar18 == 0) {
          uVar18 = 0;
        }
        else {
          pfVar4 = ppfVar14[uVar20];
          uVar22 = 0;
          do {
            fVar23 = pfVar4[uVar22];
            if (mVar1 == ma_format_f32) {
              (pConverter->weights).f32[uVar20][uVar22] = fVar23;
            }
            else {
              (pConverter->weights).f32[uVar20][uVar22] = (float)(int)(fVar23 * 4096.0);
              uVar16 = pConverter->channelsOut;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < uVar16);
          uVar22 = (ulong)pConverter->channelsIn;
          uVar18 = uVar16;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar22);
      return MA_SUCCESS;
    }
    uVar20 = 0;
    if ((int)uVar22 != 0) {
      pmVar17 = pConverter->pChannelMapIn;
      uVar21 = 0;
      do {
        if (pmVar17 == (ma_channel *)0x0) {
          bVar8 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,(ma_uint32)uVar22,(ma_uint32)uVar21);
        }
        else {
          bVar8 = pmVar17[uVar21];
        }
        if (((5 < bVar8) || ((0x23U >> (bVar8 & 0x1f) & 1) == 0)) && (0x1f < (byte)(bVar8 - 0x14)))
        {
          lVar15 = 0;
          do {
            fVar23 = *(float *)((long)g_maChannelPlaneRatios[0] +
                               (ulong)((uint)bVar8 * 8) * 3 + lVar15 * 4);
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              mVar19 = pConverter->channelsOut;
              pmVar3 = pConverter->pChannelMapOut;
              mVar11 = ma_channel_map_contains_channel_position(mVar19,pmVar3,bVar8);
              if (mVar19 != 0 && mVar11 == 0) {
                uVar22 = 0;
                do {
                  if (pmVar3 == (ma_channel *)0x0) {
                    bVar7 = ma_channel_map_init_standard_channel
                                      (ma_standard_channel_map_default,mVar19,(ma_uint32)uVar22);
                  }
                  else {
                    bVar7 = pmVar3[uVar22];
                  }
                  if (((5 < bVar7) || ((0x23U >> (bVar7 & 0x1f) & 1) == 0)) &&
                     (0x1f < (byte)(bVar7 - 0x14))) {
                    lVar15 = 0;
                    do {
                      if ((g_maChannelPlaneRatios[bVar7][lVar15] != 0.0) ||
                         (NAN(g_maChannelPlaneRatios[bVar7][lVar15]))) {
                        fVar23 = 0.0;
                        if (mVar2 == ma_channel_mix_mode_default) {
                          fVar23 = g_maChannelPlaneRatios[bVar8][5] *
                                   g_maChannelPlaneRatios[bVar7][5] +
                                   g_maChannelPlaneRatios[bVar8][3] *
                                   g_maChannelPlaneRatios[bVar7][3] +
                                   g_maChannelPlaneRatios[bVar8][2] *
                                   g_maChannelPlaneRatios[bVar7][2] +
                                   g_maChannelPlaneRatios[bVar8][0] *
                                   g_maChannelPlaneRatios[bVar7][0] +
                                   g_maChannelPlaneRatios[bVar8][1] *
                                   g_maChannelPlaneRatios[bVar7][1] + 0.0;
                        }
                        pfVar4 = (pConverter->weights).f32[uVar21];
                        if (mVar1 == ma_format_f32) {
                          if ((pfVar4[uVar22] == 0.0) && (!NAN(pfVar4[uVar22]))) {
                            pfVar4[uVar22] = fVar23;
                          }
                        }
                        else if (pfVar4[uVar22] == 0.0) {
                          pfVar4[uVar22] = (float)(int)(fVar23 * 4096.0);
                          mVar19 = pConverter->channelsOut;
                        }
                        break;
                      }
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 6);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 < mVar19);
                uVar22 = (ulong)pConverter->channelsIn;
              }
              break;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 6);
        }
        uVar21 = uVar21 + 1;
        uVar20 = uVar22;
      } while (uVar21 < uVar22);
    }
    mVar19 = pConverter->channelsOut;
    local_90 = uVar20;
    if (mVar19 == 0) {
      mVar19 = 0;
    }
    else {
      pmVar17 = pConverter->pChannelMapOut;
      uVar22 = 0;
      do {
        if (pmVar17 == (ma_channel *)0x0) {
          bVar8 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,mVar19,(ma_uint32)uVar22);
        }
        else {
          bVar8 = pmVar17[uVar22];
        }
        if (((5 < bVar8) || ((0x23U >> (bVar8 & 0x1f) & 1) == 0)) && (0x1f < (byte)(bVar8 - 0x14)))
        {
          lVar15 = 0;
          do {
            fVar23 = *(float *)((long)g_maChannelPlaneRatios[0] +
                               (ulong)((uint)bVar8 * 8) * 3 + lVar15 * 4);
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              pmVar3 = pConverter->pChannelMapIn;
              mVar11 = ma_channel_map_contains_channel_position((ma_uint32)uVar20,pmVar3,bVar8);
              if (mVar11 == 0) {
                if ((ma_uint32)uVar20 == 0) {
                  uVar20 = 0;
                }
                else {
                  uVar21 = 0;
                  do {
                    if (pmVar3 == (ma_channel *)0x0) {
                      bVar7 = ma_channel_map_init_standard_channel
                                        (ma_standard_channel_map_default,(ma_uint32)uVar20,
                                         (ma_uint32)uVar21);
                    }
                    else {
                      bVar7 = pmVar3[uVar21];
                    }
                    if (((5 < bVar7) || ((0x23U >> (bVar7 & 0x1f) & 1) == 0)) &&
                       (0x1f < (byte)(bVar7 - 0x14))) {
                      lVar15 = 0;
                      do {
                        if ((g_maChannelPlaneRatios[bVar7][lVar15] != 0.0) ||
                           (NAN(g_maChannelPlaneRatios[bVar7][lVar15]))) {
                          fVar23 = 0.0;
                          if (mVar2 == ma_channel_mix_mode_default) {
                            fVar23 = g_maChannelPlaneRatios[bVar7][5] *
                                     g_maChannelPlaneRatios[bVar8][5] +
                                     g_maChannelPlaneRatios[bVar7][3] *
                                     g_maChannelPlaneRatios[bVar8][3] +
                                     g_maChannelPlaneRatios[bVar7][2] *
                                     g_maChannelPlaneRatios[bVar8][2] +
                                     g_maChannelPlaneRatios[bVar7][0] *
                                     g_maChannelPlaneRatios[bVar8][0] +
                                     g_maChannelPlaneRatios[bVar7][1] *
                                     g_maChannelPlaneRatios[bVar8][1] + 0.0;
                          }
                          pfVar4 = (pConverter->weights).f32[uVar21];
                          if (mVar1 == ma_format_f32) {
                            if ((pfVar4[uVar22] == 0.0) && (!NAN(pfVar4[uVar22]))) {
                              pfVar4[uVar22] = fVar23;
                            }
                          }
                          else if (pfVar4[uVar22] == 0.0) {
                            pfVar4[uVar22] = (float)(int)(fVar23 * 4096.0);
                            local_90 = (ulong)pConverter->channelsIn;
                          }
                          break;
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 != 6);
                    }
                    uVar21 = uVar21 + 1;
                    uVar20 = local_90;
                  } while (uVar21 < local_90);
                  mVar19 = pConverter->channelsOut;
                }
              }
              break;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 6);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < mVar19);
    }
    if (pConfig->calculateLFEFromSpatialChannels == 0) {
      return MA_SUCCESS;
    }
    pmVar17 = pConverter->pChannelMapIn;
    mVar11 = ma_channel_map_contains_channel_position((ma_uint32)local_90,pmVar17,'\x05');
    if (mVar11 != 0) {
      return MA_SUCCESS;
    }
    mVar12 = ma_channel_map_get_spatial_channel_count(pmVar17,(ma_uint32)local_90);
    if (((mVar12 != 0) &&
        (mVar11 = ma_channel_map_find_channel_position
                            (mVar19,pConverter->pChannelMapOut,'\x05',&local_5c), mVar11 != 0)) &&
       ((ma_uint32)local_90 != 0)) {
      uVar22 = 0;
      do {
        if (pmVar17 == (ma_channel *)0x0) {
          bVar8 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,(ma_uint32)local_90,(ma_uint32)uVar22);
        }
        else {
          bVar8 = pmVar17[uVar22];
        }
        if (((5 < bVar8) || ((0x23U >> (bVar8 & 0x1f) & 1) == 0)) && (0x1f < (byte)(bVar8 - 0x14)))
        {
          lVar15 = 0;
          do {
            if ((g_maChannelPlaneRatios[bVar8][lVar15] != 0.0) ||
               (NAN(g_maChannelPlaneRatios[bVar8][lVar15]))) {
              pfVar4 = (pConverter->weights).f32[uVar22];
              uVar20 = (ulong)local_5c;
              if (mVar1 == ma_format_f32) {
                if ((pfVar4[uVar20] == 0.0) && (!NAN(pfVar4[uVar20]))) {
                  pfVar4[uVar20] = 1.0 / (float)mVar12;
                }
              }
              else if (pfVar4[uVar20] == 0.0) {
                pfVar4[uVar20] = (float)(int)((1.0 / (float)mVar12) * 4096.0);
                local_90 = (ulong)pConverter->channelsIn;
              }
              break;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 6);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < local_90);
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_channel_converter_init_preallocated(const ma_channel_converter_config* pConfig, void* pHeap, ma_channel_converter* pConverter)
{
    ma_result result;
    ma_channel_converter_heap_layout heapLayout;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_channel_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pConverter->_pHeap, heapLayout.sizeInBytes);

    pConverter->format      = pConfig->format;
    pConverter->channelsIn  = pConfig->channelsIn;
    pConverter->channelsOut = pConfig->channelsOut;
    pConverter->mixingMode  = pConfig->mixingMode;

    if (pConfig->pChannelMapIn != NULL) {
        pConverter->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapIn, pConfig->channelsIn, pConfig->pChannelMapIn, pConfig->channelsIn);
    } else {
        pConverter->pChannelMapIn = NULL;   /* Use default channel map. */
    }

    if (pConfig->pChannelMapOut != NULL) {
        pConverter->pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    } else {
        pConverter->pChannelMapOut = NULL;  /* Use default channel map. */
    }

    pConverter->conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    if (pConverter->conversionPath == ma_channel_conversion_path_shuffle) {
        pConverter->pShuffleTable = (ma_uint8*)ma_offset_ptr(pHeap, heapLayout.shuffleTableOffset);
        ma_channel_map_build_shuffle_table(pConverter->pChannelMapIn, pConverter->channelsIn, pConverter->pChannelMapOut, pConverter->channelsOut, pConverter->pShuffleTable);
    }

    if (pConverter->conversionPath == ma_channel_conversion_path_weights) {
        ma_uint32 iChannelIn;
        ma_uint32 iChannelOut;

        if (pConverter->format == ma_format_f32) {
            pConverter->weights.f32 = (float**   )ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.f32[iChannelIn] = (float*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(float*) * pConverter->channelsIn) + (sizeof(float) * pConverter->channelsOut * iChannelIn)));
            }
        } else {
            pConverter->weights.s16 = (ma_int32**)ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.s16[iChannelIn] = (ma_int32*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(ma_int32*) * pConverter->channelsIn) + (sizeof(ma_int32) * pConverter->channelsOut * iChannelIn)));
            }
        }

        /* Silence our weights by default. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                if (pConverter->format == ma_format_f32) {
                    pConverter->weights.f32[iChannelIn][iChannelOut] = 0.0f;
                } else {
                    pConverter->weights.s16[iChannelIn][iChannelOut] = 0;
                }
            }
        }

        /*
        We now need to fill out our weights table. This is determined by the mixing mode.
        */

        /* In all cases we need to make sure all channels that are present in both channel maps have a 1:1 mapping. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
            ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                if (channelPosIn == channelPosOut) {
                    float weight = 1;

                    if (pConverter->format == ma_format_f32) {
                        pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                    } else {
                        pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                    }
                }
            }
        }

        switch (pConverter->mixingMode)
        {
            case ma_channel_mix_mode_custom_weights:
            {
                if (pConfig->ppWeights == NULL) {
                    return MA_INVALID_ARGS; /* Config specified a custom weights mixing mode, but no custom weights have been specified. */
                }

                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                    for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                        float weight = pConfig->ppWeights[iChannelIn][iChannelOut];

                        if (pConverter->format == ma_format_f32) {
                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                        } else {
                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                        }
                    }
                }
            } break;

            case ma_channel_mix_mode_simple:
            {
                /*
                In simple mode, only set weights for channels that have exactly matching types, leave the rest at
                zero. The 1:1 mappings have already been covered before this switch statement.
                */
            } break;

            case ma_channel_mix_mode_rectangular:
            default:
            {
                /* Unmapped input channels. */
                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                    ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                    if (ma_is_spatial_channel_position(channelPosIn)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, channelPosIn)) {
                            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                                if (ma_is_spatial_channel_position(channelPosOut)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* Unmapped output channels. */
                for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                    ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                    if (ma_is_spatial_channel_position(channelPosOut)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, channelPosOut)) {
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* If LFE is in the output channel map but was not present in the input channel map, configure its weight now */
                if (pConfig->calculateLFEFromSpatialChannels) {
                    if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, MA_CHANNEL_LFE)) {
                        ma_uint32 spatialChannelCount = ma_channel_map_get_spatial_channel_count(pConverter->pChannelMapIn, pConverter->channelsIn);
                        ma_uint32 iChannelOutLFE;

                        if (spatialChannelCount > 0 && ma_channel_map_find_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, MA_CHANNEL_LFE, &iChannelOutLFE)) {
                            const float weightForLFE = 1.0f / spatialChannelCount;
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                const ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);
                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOutLFE] = weightForLFE;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOutLFE] = ma_channel_converter_float_to_fixed(weightForLFE);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            } break;
        }
    }

    return MA_SUCCESS;
}